

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

void __thiscall Png::Png(Png *this,path *filePath)

{
  File *this_00;
  png_structp *pppVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  int *piVar4;
  png_colorp ppVar5;
  void *pvVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char cVar17;
  byte bVar18;
  int iVar19;
  uint32_t uVar20;
  undefined4 extraout_var;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>,_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  pbVar21;
  png_structp ppVar22;
  png_infop ppVar23;
  size_type __n;
  int *piVar24;
  char *pcVar25;
  uint uVar26;
  bool *pbVar27;
  uint uVar28;
  uint uVar29;
  char *pcVar30;
  int iVar31;
  uint uVar32;
  Rgba *pRVar33;
  ulong uVar34;
  long lVar35;
  png_uint_32 y;
  png_uint_32 pVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  Rgba local_dc;
  File *local_d8;
  int interlaceType;
  int bitDepth;
  DefaultInitVec<png_byte> row;
  vector<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
  conflicts;
  array<unsigned_char,_8UL> pngHeader;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indeterminates;
  anon_class_24_3_904f71aa assignColor;
  
  conflicts.
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       conflicts.
       super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this->path = filePath;
  this_00 = &this->file;
  *(undefined8 *)
   &(this->file)._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_> = 0;
  *(__index_type *)
   ((long)&(this->file)._file.
           super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
           .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
           super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
           super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
           super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_> + 0xf0) =
       '\0';
  pppVar1 = &this->png;
  pbVar27 = &(this->colors)._colors._M_elems[0].super__Optional_base<Rgba,_true,_true>._M_payload.
             super__Optional_payload_base<Rgba>._M_engaged;
  this->png = (png_structp)0x0;
  this->info = (png_infop)0x0;
  lVar37 = 0;
  memset(&this->pixels,0,0x2801d);
  auVar16 = _DAT_00117300;
  auVar15 = _DAT_001172f0;
  auVar14 = _DAT_001172e0;
  auVar13 = _DAT_001172d0;
  auVar12 = _DAT_001172c0;
  auVar11 = _DAT_001172b0;
  auVar10 = _DAT_001172a0;
  auVar9 = _DAT_00117290;
  auVar8 = _DAT_00117280;
  do {
    auVar38._8_4_ = (int)lVar37;
    auVar38._0_8_ = lVar37;
    auVar38._12_4_ = (int)((ulong)lVar37 >> 0x20);
    auVar39 = (auVar38 | auVar11) ^ auVar12;
    iVar19 = auVar39._0_4_;
    iVar31 = auVar39._8_4_;
    auVar48._4_4_ = iVar19;
    auVar48._0_4_ = iVar19;
    auVar48._8_4_ = iVar31;
    auVar48._12_4_ = iVar31;
    auVar56._0_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar56._4_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar56._8_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar56._12_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar40._0_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar40._4_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar40._8_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar40._12_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar40 = auVar40 & auVar56;
    auVar39 = pshuflw(auVar48,auVar40,0xe8);
    auVar39 = packssdw(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *pbVar27 = false;
    }
    auVar39 = packssdw(auVar40,auVar40);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._0_4_ >> 8 & 1) != 0) {
      pbVar27[5] = false;
    }
    auVar39 = (auVar38 | auVar10) ^ auVar12;
    iVar19 = auVar39._0_4_;
    iVar31 = auVar39._8_4_;
    auVar49._4_4_ = iVar19;
    auVar49._0_4_ = iVar19;
    auVar49._8_4_ = iVar31;
    auVar49._12_4_ = iVar31;
    auVar57._0_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar57._4_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar57._8_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar57._12_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar41._0_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar41._4_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar41._8_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar41._12_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar41 = auVar41 & auVar57;
    auVar39 = packssdw(auVar49,auVar41);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
      pbVar27[10] = false;
    }
    auVar39 = pshufhw(auVar41,auVar41,0x84);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._0_4_ >> 0x18 & 1) != 0) {
      pbVar27[0xf] = false;
    }
    auVar39 = (auVar38 | auVar9) ^ auVar12;
    iVar19 = auVar39._0_4_;
    iVar31 = auVar39._8_4_;
    auVar50._4_4_ = iVar19;
    auVar50._0_4_ = iVar19;
    auVar50._8_4_ = iVar31;
    auVar50._12_4_ = iVar31;
    auVar58._0_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar58._4_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar58._8_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar58._12_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar42._0_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar42._4_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar42._8_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar42._12_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar42 = auVar42 & auVar58;
    auVar39 = pshuflw(auVar50,auVar42,0xe8);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pbVar27[0x14] = false;
    }
    auVar39 = packssdw(auVar42,auVar42);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._4_2_ >> 8 & 1) != 0) {
      pbVar27[0x19] = false;
    }
    auVar39 = (auVar38 | auVar8) ^ auVar12;
    iVar19 = auVar39._0_4_;
    iVar31 = auVar39._8_4_;
    auVar51._4_4_ = iVar19;
    auVar51._0_4_ = iVar19;
    auVar51._8_4_ = iVar31;
    auVar51._12_4_ = iVar31;
    auVar59._0_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar59._4_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar59._8_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar59._12_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar43._0_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar43._4_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar43._8_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar43._12_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar43 = auVar43 & auVar59;
    auVar39 = packssdw(auVar51,auVar43);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pbVar27[0x1e] = false;
    }
    auVar39 = pshufhw(auVar43,auVar43,0x84);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._6_2_ >> 8 & 1) != 0) {
      pbVar27[0x23] = false;
    }
    auVar39 = (auVar38 | auVar16) ^ auVar12;
    iVar19 = auVar39._0_4_;
    iVar31 = auVar39._8_4_;
    auVar52._4_4_ = iVar19;
    auVar52._0_4_ = iVar19;
    auVar52._8_4_ = iVar31;
    auVar52._12_4_ = iVar31;
    auVar60._0_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar60._4_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar60._8_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar60._12_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar44._0_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar44._4_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar44._8_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar44._12_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar44 = auVar44 & auVar60;
    auVar39 = pshuflw(auVar52,auVar44,0xe8);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pbVar27[0x28] = false;
    }
    auVar39 = packssdw(auVar44,auVar44);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._8_2_ >> 8 & 1) != 0) {
      pbVar27[0x2d] = false;
    }
    auVar39 = (auVar38 | auVar15) ^ auVar12;
    iVar19 = auVar39._0_4_;
    iVar31 = auVar39._8_4_;
    auVar53._4_4_ = iVar19;
    auVar53._0_4_ = iVar19;
    auVar53._8_4_ = iVar31;
    auVar53._12_4_ = iVar31;
    auVar61._0_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar61._4_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar61._8_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar61._12_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar45._0_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar45._4_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar45._8_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar45._12_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar45 = auVar45 & auVar61;
    auVar39 = packssdw(auVar53,auVar45);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      pbVar27[0x32] = false;
    }
    auVar39 = pshufhw(auVar45,auVar45,0x84);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._10_2_ >> 8 & 1) != 0) {
      pbVar27[0x37] = false;
    }
    auVar39 = (auVar38 | auVar14) ^ auVar12;
    iVar19 = auVar39._0_4_;
    iVar31 = auVar39._8_4_;
    auVar54._4_4_ = iVar19;
    auVar54._0_4_ = iVar19;
    auVar54._8_4_ = iVar31;
    auVar54._12_4_ = iVar31;
    auVar62._0_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar62._4_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar62._8_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar62._12_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar46._0_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar46._4_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar46._8_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar46._12_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar46 = auVar46 & auVar62;
    auVar39 = pshuflw(auVar54,auVar46,0xe8);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pbVar27[0x3c] = false;
    }
    auVar39 = packssdw(auVar46,auVar46);
    auVar39 = packssdw(auVar39,auVar39);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._12_2_ >> 8 & 1) != 0) {
      pbVar27[0x41] = false;
    }
    auVar38 = (auVar38 | auVar13) ^ auVar12;
    iVar19 = auVar38._0_4_;
    iVar31 = auVar38._8_4_;
    auVar47._4_4_ = iVar19;
    auVar47._0_4_ = iVar19;
    auVar47._8_4_ = iVar31;
    auVar47._12_4_ = iVar31;
    auVar55._0_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar55._4_4_ = -(uint)(iVar19 < -0x7fff7fff);
    auVar55._8_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar55._12_4_ = -(uint)(iVar31 < -0x7fff7fff);
    auVar39._0_4_ = -(uint)(auVar38._4_4_ == -0x80000000);
    auVar39._4_4_ = -(uint)(auVar38._4_4_ == -0x80000000);
    auVar39._8_4_ = -(uint)(auVar38._12_4_ == -0x80000000);
    auVar39._12_4_ = -(uint)(auVar38._12_4_ == -0x80000000);
    auVar39 = auVar39 & auVar55;
    auVar38 = packssdw(auVar47,auVar39);
    auVar38 = packssdw(auVar38,auVar38);
    auVar38 = packsswb(auVar38,auVar38);
    if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pbVar27[0x46] = false;
    }
    auVar38 = pshufhw(auVar39,auVar39,0x84);
    auVar38 = packssdw(auVar38,auVar38);
    auVar38 = packsswb(auVar38,auVar38);
    if ((auVar38._14_2_ >> 8 & 1) != 0) {
      pbVar27[0x4b] = false;
    }
    lVar37 = lVar37 + 0x10;
    pbVar27 = pbVar27 + 0x50;
  } while (lVar37 != 0x8010);
  this->embeddedPal = (png_colorp)0x0;
  this->transparencyPal = (png_bytep)0x0;
  iVar19 = File::open(this_00,(char *)filePath,0xc);
  if (CONCAT44(extraout_var,iVar19) == 0) {
    conflicts.
    super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this->path;
    std::
    visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
              ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                *)&row,(Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
                        *)&conflicts,&this_00->_file);
    piVar24 = __errno_location();
    pcVar30 = strerror(*piVar24);
    fatal("Failed to open input image (\"%s\"): %s",
          CONCAT44(row.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                   (int)row.
                        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start),pcVar30);
  }
  Options::verbosePrint(&options,'\x02',"Opened input file\n");
  pbVar21 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                            *)&row,&this_00->_file);
  lVar37 = (**(code **)(*(long *)pbVar21 + 0x40))(pbVar21,&pngHeader,8);
  if ((lVar37 != 8) || (iVar19 = png_sig_cmp(&pngHeader,0,8), iVar19 != 0)) {
    conflicts.
    super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this->path;
    std::
    visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
              ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                *)&row,(Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
                        *)&conflicts,&this_00->_file);
    fatal("Input file (\"%s\") is not a PNG image!",
          CONCAT44(row.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                   (int)row.
                        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start));
  }
  Options::verbosePrint(&options,'\x03',"PNG header signature is OK\n");
  ppVar22 = (png_structp)png_create_read_struct("1.6.37",this,handleError,handleWarning);
  *pppVar1 = ppVar22;
  if (ppVar22 == (png_structp)0x0) {
    pcVar30 = "Failed to allocate PNG structure: %s";
  }
  else {
    ppVar23 = (png_infop)png_create_info_struct(ppVar22);
    this->info = ppVar23;
    if (ppVar23 != (png_infop)0x0) {
      png_set_read_fn(this->png,this,readData);
      png_set_sig_bytes(*pppVar1,8);
      png_read_info(this->png,this->info);
      puVar2 = &this->width;
      puVar3 = &this->height;
      piVar24 = &this->colorType;
      png_get_IHDR(this->png,this->info,puVar2,puVar3,&bitDepth,piVar24,&interlaceType,
                   (undefined1  [16])0x0);
      if ((options.inputSlice.width == 0) && ((*puVar2 & 7) != 0)) {
        pcVar30 = "Image width (%u pixels) is not a multiple of 8!";
      }
      else {
        if ((*puVar3 & 7) == 0 || options.inputSlice.height != 0) {
          std::vector<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>::resize
                    (&this->pixels,(ulong)*puVar2 * (ulong)*puVar3);
          pcVar30 = "Unknown color type %d";
          local_d8 = this_00;
          if (((uint)*piVar24 < 7) && ((0x5dU >> (*piVar24 & 0x1fU) & 1) != 0)) {
            if ((interlaceType == 0) || (interlaceType == 1)) {
              Options::verbosePrint
                        (&options,'\x03',"Input image: %ux%u pixels, %dbpp %s, %s\n",(ulong)*puVar2,
                         (ulong)*puVar3,(ulong)(uint)bitDepth);
              piVar4 = &this->nbColors;
              iVar19 = png_get_PLTE(this->png,this->info,&this->embeddedPal,piVar4);
              if (iVar19 == 0) {
                Options::verbosePrint(&options,'\x03',"No embedded palette\n");
              }
              else {
                iVar19 = png_get_tRNS(this->png,this->info,&this->transparencyPal,&row,0);
                if ((iVar19 != 0) &&
                   ((int)row.
                         super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start != *piVar4)) {
                  __assert_fail("nbTransparentEntries == nbColors",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                                ,0x107,"Png");
                }
                Options::verbosePrint(&options,'\x03',"Embedded palette has %d colors: [");
                if (0 < *piVar4) {
                  lVar37 = 2;
                  lVar35 = 0;
                  do {
                    ppVar5 = this->embeddedPal;
                    Options::verbosePrint
                              (&options,'\x03',"#%02x%02x%02x%02x%s",
                               (ulong)*(byte *)((long)ppVar5 + lVar37 + -2),
                               (ulong)*(byte *)((long)ppVar5 + lVar37 + -1),
                               (ulong)(&ppVar5->red)[lVar37]);
                    lVar35 = lVar35 + 1;
                    lVar37 = lVar37 + 3;
                  } while (lVar35 < *piVar4);
                }
              }
              if ((*piVar24 & 0xfffffffbU) == 3) {
                png_set_palette_to_rgb(*pppVar1);
              }
              else if ((*piVar24 & 0xfffffffbU) == 0) {
                png_set_gray_to_rgb(*pppVar1);
              }
              iVar19 = png_get_valid(this->png,this->info,0x10);
              if (iVar19 == 0) {
                if ((*piVar24 & 4) == 0) {
                  png_set_add_alpha(*pppVar1,0xffff,1);
                }
              }
              else {
                png_set_tRNS_to_alpha(*pppVar1);
              }
              if (bitDepth == 0x10) {
                png_set_scale_16(*pppVar1);
              }
              else if (bitDepth < 8) {
                png_set_packing(*pppVar1);
              }
              png_read_update_info(this->png,this->info);
              uVar20 = png_get_image_width(this->png,this->info);
              if (uVar20 != *puVar2) {
                __assert_fail("png_get_image_width(png, info) == width",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                              ,0x138,"Png");
              }
              uVar20 = png_get_image_height(this->png,this->info);
              if (uVar20 != *puVar3) {
                __assert_fail("png_get_image_height(png, info) == height",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                              ,0x139,"Png");
              }
              cVar17 = png_get_color_type(this->png,this->info);
              if (cVar17 != '\x06') {
                __assert_fail("png_get_color_type(png, info) == PNG_COLOR_TYPE_RGBA",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                              ,0x13b,"Png");
              }
              cVar17 = png_get_bit_depth(this->png,this->info);
              if (cVar17 != '\b') {
                __assert_fail("png_get_bit_depth(png, info) == 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                              ,0x13c,"Png");
              }
              __n = png_get_rowbytes(this->png,this->info);
              if (__n != 0) {
                std::
                vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::vector(&row,__n,(allocator_type *)&conflicts);
                conflicts.
                super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                conflicts.
                super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                conflicts.
                super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                assignColor.indeterminates = &indeterminates;
                indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                assignColor.this = this;
                assignColor.conflicts = &conflicts;
                if (interlaceType == 0) {
                  if (*puVar3 != 0) {
                    pVar36 = 0;
                    do {
                      png_read_row(*pppVar1,CONCAT44(row.
                                                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (int)row.
                                                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),0);
                      if (*puVar2 != 0) {
                        uVar26 = 0;
                        uVar34 = 0;
                        do {
                          local_dc = *(Rgba *)(CONCAT44(row.
                                                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (int)row.
                                                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                              (ulong)uVar26);
                          Png::anon_class_24_3_904f71aa::operator()
                                    (&assignColor,(png_uint_32)uVar34,pVar36,&local_dc);
                          uVar34 = uVar34 + 1;
                          uVar26 = uVar26 + 4;
                        } while (uVar34 < *puVar2);
                      }
                      pVar36 = pVar36 + 1;
                    } while (pVar36 < *puVar3);
                  }
                }
                else {
                  if (interlaceType != 1) {
                    __assert_fail("interlaceType == PNG_INTERLACE_ADAM7",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                                  ,0x171,"Png");
                  }
                  uVar26 = *puVar2;
                  uVar28 = 0;
                  do {
                    bVar18 = (byte)(7 - uVar28 >> 1);
                    if (uVar28 < 2) {
                      bVar18 = 3;
                    }
                    iVar19 = 1 << (bVar18 & 0x1f);
                    uVar32 = uVar28 + 1;
                    uVar29 = (uVar28 & 1) << (3U - (char)(uVar32 >> 1) & 0x1f);
                    uVar7 = uVar29 & 7;
                    if (~(uVar29 & 7) + iVar19 + uVar26 >> (bVar18 & 0x1f) != 0) {
                      bVar18 = (byte)(8 - uVar28 >> 1);
                      if (uVar28 < 3) {
                        bVar18 = 3;
                      }
                      iVar31 = 1 << (bVar18 & 0x1f);
                      pVar36 = (uVar28 & 1 ^ 1) << (3U - (char)(uVar28 >> 1) & 0x1f) & 7;
                      if ((~pVar36 + *puVar3 + iVar31 >> (bVar18 & 0x1f) != 0) && (pVar36 < *puVar3)
                         ) {
                        do {
                          pRVar33 = (Rgba *)CONCAT44(row.
                                                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (int)row.
                                                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          png_read_row(*pppVar1,pRVar33,0);
                          uVar26 = *puVar2;
                          uVar28 = uVar7;
                          if (uVar7 < uVar26) {
                            do {
                              local_dc = *pRVar33;
                              Png::anon_class_24_3_904f71aa::operator()
                                        (&assignColor,uVar28,pVar36,&local_dc);
                              pRVar33 = pRVar33 + 1;
                              uVar28 = uVar28 + iVar19;
                              uVar26 = *puVar2;
                            } while (uVar28 < uVar26);
                          }
                          pVar36 = pVar36 + iVar31;
                        } while (pVar36 < *puVar3);
                      }
                    }
                    uVar28 = uVar32;
                  } while (uVar32 != 7);
                }
                png_read_end(*pppVar1,0);
                if (indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(indeterminates.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)indeterminates.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)indeterminates.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (conflicts.
                    super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(conflicts.
                                  super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)conflicts.
                                        super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)conflicts.
                                        super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                pvVar6 = (void *)CONCAT44(row.
                                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)row.
                                               super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
                if (pvVar6 != (void *)0x0) {
                  operator_delete(pvVar6,(long)row.
                                               super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)pvVar6);
                }
                return;
              }
              __assert_fail("nbRowBytes != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                            ,0x141,"Png");
            }
            pcVar30 = "Unknown interlace type %d";
          }
          fatal(pcVar30);
        }
        pcVar30 = "Image height (%u pixels) is not a multiple of 8!";
      }
      fatal(pcVar30);
    }
    png_destroy_read_struct(pppVar1,0,0);
    pcVar30 = "Failed to allocate PNG info structure: %s";
  }
  piVar24 = __errno_location();
  pcVar25 = strerror(*piVar24);
  fatal(pcVar30,pcVar25);
}

Assistant:

explicit Png(std::filesystem::path const &filePath) : path(filePath), colors() {
		if (file.open(path, std::ios_base::in | std::ios_base::binary) == nullptr) {
			fatal("Failed to open input image (\"%s\"): %s", file.string(path).c_str(),
			      strerror(errno));
		}

		options.verbosePrint(Options::VERB_LOG_ACT, "Opened input file\n");

		std::array<unsigned char, 8> pngHeader;

		if (file->sgetn(reinterpret_cast<char *>(pngHeader.data()), pngHeader.size())
		        != static_cast<std::streamsize>(pngHeader.size()) // Not enough bytes?
		    || png_sig_cmp(pngHeader.data(), 0, pngHeader.size()) != 0) {
			fatal("Input file (\"%s\") is not a PNG image!", file.string(path).c_str());
		}

		options.verbosePrint(Options::VERB_INTERM, "PNG header signature is OK\n");

		png = png_create_read_struct(PNG_LIBPNG_VER_STRING, (png_voidp)this, handleError,
		                             handleWarning);
		if (!png) {
			fatal("Failed to allocate PNG structure: %s", strerror(errno));
		}

		info = png_create_info_struct(png);
		if (!info) {
			png_destroy_read_struct(&png, nullptr, nullptr);
			fatal("Failed to allocate PNG info structure: %s", strerror(errno));
		}

		png_set_read_fn(png, this, readData);
		png_set_sig_bytes(png, pngHeader.size());

		// TODO: png_set_crc_action(png, PNG_CRC_ERROR_QUIT, PNG_CRC_WARN_DISCARD);

		// Skipping chunks we don't use should improve performance
		// TODO: png_set_keep_unknown_chunks(png, ...);

		// Process all chunks up to but not including the image data
		png_read_info(png, info);

		int bitDepth, interlaceType; //, compressionType, filterMethod;

		png_get_IHDR(png, info, &width, &height, &bitDepth, &colorType, &interlaceType, nullptr,
		             nullptr);

		if (options.inputSlice.width == 0 && width % 8 != 0) {
			fatal("Image width (%" PRIu32 " pixels) is not a multiple of 8!", width);
		}
		if (options.inputSlice.height == 0 && height % 8 != 0) {
			fatal("Image height (%" PRIu32 " pixels) is not a multiple of 8!", height);
		}

		pixels.resize(static_cast<size_t>(width) * static_cast<size_t>(height));

		auto colorTypeName = [this]() {
			switch (colorType) {
			case PNG_COLOR_TYPE_GRAY:
				return "grayscale";
			case PNG_COLOR_TYPE_GRAY_ALPHA:
				return "grayscale + alpha";
			case PNG_COLOR_TYPE_PALETTE:
				return "palette";
			case PNG_COLOR_TYPE_RGB:
				return "RGB";
			case PNG_COLOR_TYPE_RGB_ALPHA:
				return "RGB + alpha";
			default:
				fatal("Unknown color type %d", colorType);
			}
		};
		auto interlaceTypeName = [&interlaceType]() {
			switch (interlaceType) {
			case PNG_INTERLACE_NONE:
				return "not interlaced";
			case PNG_INTERLACE_ADAM7:
				return "interlaced (Adam7)";
			default:
				fatal("Unknown interlace type %d", interlaceType);
			}
		};
		options.verbosePrint(Options::VERB_INTERM,
		                     "Input image: %" PRIu32 "x%" PRIu32 " pixels, %dbpp %s, %s\n", width,
		                     height, bitDepth, colorTypeName(), interlaceTypeName());

		if (png_get_PLTE(png, info, &embeddedPal, &nbColors) != 0) {
			int nbTransparentEntries;
			if (png_get_tRNS(png, info, &transparencyPal, &nbTransparentEntries, nullptr)) {
				assert(nbTransparentEntries == nbColors);
			}

			options.verbosePrint(Options::VERB_INTERM, "Embedded palette has %d colors: [",
			                     nbColors);
			for (int i = 0; i < nbColors; ++i) {
				auto const &color = embeddedPal[i];
				options.verbosePrint(
				    Options::VERB_INTERM, "#%02x%02x%02x%02x%s", color.red, color.green, color.blue,
				    transparencyPal ? transparencyPal[i] : 0xFF, i != nbColors - 1 ? ", " : "]\n");
			}
		} else {
			options.verbosePrint(Options::VERB_INTERM, "No embedded palette\n");
		}

		// Set up transformations; to turn everything into RGBA888
		// TODO: it's not necessary to uniformize the pixel data (in theory), and not doing
		// so *might* improve performance, and should reduce memory usage.

		// Convert grayscale to RGB
		switch (colorType & ~PNG_COLOR_MASK_ALPHA) {
		case PNG_COLOR_TYPE_GRAY:
			png_set_gray_to_rgb(png); // This also converts tRNS to alpha
			break;
		case PNG_COLOR_TYPE_PALETTE:
			png_set_palette_to_rgb(png);
			break;
		}

		if (png_get_valid(png, info, PNG_INFO_tRNS)) {
			// If we read a tRNS chunk, convert it to alpha
			png_set_tRNS_to_alpha(png);
		} else if (!(colorType & PNG_COLOR_MASK_ALPHA)) {
			// Otherwise, if we lack an alpha channel, default to full opacity
			png_set_add_alpha(png, 0xFFFF, PNG_FILLER_AFTER);
		}

		// Scale 16bpp back to 8 (we don't need all of that precision anyway)
		if (bitDepth == 16) {
			png_set_scale_16(png);
		} else if (bitDepth < 8) {
			png_set_packing(png);
		}

		// Do NOT call `png_set_interlace_handling`. We want to expand the rows ourselves.

		// Update `info` with the transformations
		png_read_update_info(png, info);
		// These shouldn't have changed
		assert(png_get_image_width(png, info) == width);
		assert(png_get_image_height(png, info) == height);
		// These should have changed, however
		assert(png_get_color_type(png, info) == PNG_COLOR_TYPE_RGBA);
		assert(png_get_bit_depth(png, info) == 8);

		// Now that metadata has been read, we can process the image data

		size_t nbRowBytes = png_get_rowbytes(png, info);
		assert(nbRowBytes != 0);
		DefaultInitVec<png_byte> row(nbRowBytes);
		// Holds known-conflicting color pairs to avoid warning about them twice.
		// We don't need to worry about transitivity, as ImagePalette slots are immutable once
		// assigned, and conflicts always occur between that and another color.
		// For the same reason, we don't need to worry about order, either.
		std::vector<std::tuple<uint32_t, uint32_t>> conflicts;
		// Holds colors whose alpha value is ambiguous
		std::vector<uint32_t> indeterminates;

		// Assign a color to the given position, and register it in the image palette as well
		auto assignColor = [this, &conflicts, &indeterminates](png_uint_32 x, png_uint_32 y,
		                                                       Rgba &&color) {
			if (!color.isTransparent() && !color.isOpaque()) {
				uint32_t css = color.toCSS();
				if (std::find(indeterminates.begin(), indeterminates.end(), css)
				    == indeterminates.end()) {
					error("Color #%08x is neither transparent (alpha < %u) nor opaque (alpha >= "
					      "%u) [first seen at x: %" PRIu32 ", y: %" PRIu32 "]",
					      css, Rgba::transparency_threshold, Rgba::opacity_threshold, x, y);
					indeterminates.push_back(css);
				}
			} else if (Rgba const *other = colors.registerColor(color); other) {
				std::tuple conflicting{color.toCSS(), other->toCSS()};
				// Do not report combinations twice
				if (std::find(conflicts.begin(), conflicts.end(), conflicting) == conflicts.end()) {
					warning("Fusing colors #%08x and #%08x into Game Boy color $%04x [first seen "
					        "at x: %" PRIu32 ", y: %" PRIu32 "]",
					        std::get<0>(conflicting), std::get<1>(conflicting), color.cgbColor(), x,
					        y);
					// Do not report this combination again
					conflicts.emplace_back(conflicting);
				}
			}

			pixel(x, y) = color;
		};

		if (interlaceType == PNG_INTERLACE_NONE) {
			for (png_uint_32 y = 0; y < height; ++y) {
				png_read_row(png, row.data(), nullptr);

				for (png_uint_32 x = 0; x < width; ++x) {
					assignColor(x, y,
					            Rgba(row[x * 4], row[x * 4 + 1], row[x * 4 + 2], row[x * 4 + 3]));
				}
			}
		} else {
			assert(interlaceType == PNG_INTERLACE_ADAM7);

			// For interlace to work properly, we must read the image `nbPasses` times
			for (int pass = 0; pass < PNG_INTERLACE_ADAM7_PASSES; ++pass) {
				// The interlacing pass must be skipped if its width or height is reported as zero
				if (PNG_PASS_COLS(width, pass) == 0 || PNG_PASS_ROWS(height, pass) == 0) {
					continue;
				}

				png_uint_32 xStep = 1u << PNG_PASS_COL_SHIFT(pass);
				png_uint_32 yStep = 1u << PNG_PASS_ROW_SHIFT(pass);

				for (png_uint_32 y = PNG_PASS_START_ROW(pass); y < height; y += yStep) {
					png_bytep ptr = row.data();
					png_read_row(png, ptr, nullptr);

					for (png_uint_32 x = PNG_PASS_START_COL(pass); x < width; x += xStep) {
						assignColor(x, y, Rgba(ptr[0], ptr[1], ptr[2], ptr[3]));
						ptr += 4;
					}
				}
			}
		}

		// We don't care about chunks after the image data (comments, etc.)
		png_read_end(png, nullptr);
	}